

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArgumentsTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_TestShell::createTest
          (TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_TestShell *this)

{
  TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_Test *this_00;
  TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_TestShell *this_local;
  
  this_00 = (TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/CommandLineArgumentsTest.cpp"
                         ,0x1ad);
  TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_Test::
  TEST_CommandLineArguments_setTestToRunUsingVerboseOutput_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(CommandLineArguments, setTestToRunUsingVerboseOutput)
{
    int argc = 2;
    const char* argv[] = { "tests.exe", "TEST(testgroup, testname) - stuff" };
    CHECK(newArgumentParser(argc, argv));

    TestFilter nameFilter("testname");
    TestFilter groupFilter("testgroup");
    nameFilter.strictMatching();
    groupFilter.strictMatching();
    CHECK_EQUAL(nameFilter, *args->getNameFilters());
    CHECK_EQUAL(groupFilter, *args->getGroupFilters());
}